

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eimgfs.cpp
# Opt level: O3

void __thiscall readercollection::printreadertree(readercollection *this,string *name,int level)

{
  _Rb_tree_header *p_Var1;
  _Base_ptr __n;
  undefined8 uVar2;
  int iVar3;
  undefined8 uVar4;
  _Base_ptr p_Var5;
  int iVar6;
  _Self __tmp;
  
  p_Var5 = (this->_rdbyname)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var1 = &(this->_rdbyname)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var5 != p_Var1) {
    iVar6 = 0;
    do {
      __n = p_Var5[3]._M_parent;
      if (__n == (_Base_ptr)name->_M_string_length) {
        if (__n != (_Base_ptr)0x0) {
          iVar3 = bcmp(*(void **)(p_Var5 + 3),(name->_M_dataplus)._M_p,(size_t)__n);
          if (iVar3 != 0) goto LAB_001146f8;
        }
        if (iVar6 == 0) {
          printf("%*s{\n",(ulong)(uint)(level * 4),"");
        }
        uVar2 = *(undefined8 *)(p_Var5 + 2);
        uVar4 = (**(code **)(**(long **)(p_Var5 + 4) + 0x30))();
        printf("%*s%s 0x%llx\n",(ulong)(level * 4 + 4),"",uVar2,uVar4);
        printreadertree(this,(string *)(p_Var5 + 2),level + 1);
        iVar6 = iVar6 + 1;
      }
LAB_001146f8:
      p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5);
    } while ((_Rb_tree_header *)p_Var5 != p_Var1);
    if (iVar6 != 0) {
      printf("%*s}\n",(ulong)(uint)(level * 4),"");
      return;
    }
  }
  return;
}

Assistant:

virtual bool eof()
    {
        return _pos>=size();
    }